

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

uint __thiscall IDisk::GetTrackInfo(IDisk *this,MFMTrack *mfm_track,Track *track_buffer)

{
  pointer *ppaVar1;
  uchar *puVar2;
  ILog *pIVar3;
  iterator __position;
  pointer paVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int data_count;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  byte b;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  ulong uVar18;
  uint uVar19;
  bool bVar20;
  Sector sector;
  CRC crc_local;
  anon_struct_36_14_4aa84ee9 local_88;
  uint local_64;
  Track *local_60;
  CRC local_58;
  
  CRC::CRC(&local_58);
  uVar7 = 0;
  if (0x3f < mfm_track->size) {
    uVar7 = mfm_track->size;
    local_60 = track_buffer;
    if (uVar7 != 0x40) {
      uVar19 = 0;
      uVar11 = 0;
      do {
        bVar20 = 0x50 < uVar11;
        if (bVar20) {
          puVar2 = mfm_track->bitfield;
          iVar5 = bcmp(&DAT_001a8b70,puVar2 + uVar11,0x40);
          bVar20 = iVar5 == 0;
          if (bVar20) {
            uVar7 = uVar11 - 0x50;
            bVar20 = true;
            uVar10 = 0;
            do {
              if ((puVar2[uVar7] != '\x01') || (puVar2[uVar7 + 1] != '\0')) {
                bVar20 = false;
              }
              if (0x26 < uVar10) break;
              uVar10 = uVar10 + 1;
              uVar7 = uVar7 + 2;
            } while (bVar20);
          }
        }
        if (bVar20) {
          CRC::Reset(&local_58);
          CRC::AddByteToCrc(&local_58,0xa1);
          CRC::AddByteToCrc(&local_58,0xa1);
          CRC::AddByteToCrc(&local_58,0xa1);
          CRC::AddByteToCrc(&local_58,0xfe);
          local_88.real_size = 0;
          local_88._18_2_ = 0;
          local_88.dam_offset = 0;
          local_88.dam_sync_offset = 0;
          local_88.data_crc_ok = false;
          local_88._29_3_ = 0;
          local_88.index_end = 0;
          local_88.idam_sync_offset = uVar11 - 0x50;
          local_88.idam_offset = uVar11;
          uVar7 = uVar11 + 0x41;
          uVar12 = 0xfffffffe;
          local_88.c = 0;
          do {
            uVar8 = mfm_track->size;
            if (uVar7 < mfm_track->size) {
              uVar8 = uVar19;
            }
            local_88.c = mfm_track->bitfield[uVar7 - uVar8] & 1 | local_88.c * '\x02';
            uVar7 = (uVar7 - uVar8) + 2;
            uVar12 = uVar12 + 2;
          } while (uVar12 < 0xe);
          local_88._9_7_ = 0;
          CRC::AddByteToCrc(&local_58,local_88.c);
          uVar7 = uVar11 + 0x51;
          uVar12 = 0xfffffffe;
          bVar13 = 0;
          do {
            uVar8 = mfm_track->size;
            if (uVar7 < mfm_track->size) {
              uVar8 = uVar19;
            }
            bVar13 = mfm_track->bitfield[uVar7 - uVar8] & 1 | bVar13 * '\x02';
            uVar7 = (uVar7 - uVar8) + 2;
            uVar12 = uVar12 + 2;
          } while (uVar12 < 0xe);
          local_88.h = bVar13;
          CRC::AddByteToCrc(&local_58,bVar13);
          uVar7 = uVar11 + 0x61;
          uVar12 = 0xfffffffe;
          bVar13 = 0;
          do {
            uVar8 = mfm_track->size;
            if (uVar7 < mfm_track->size) {
              uVar8 = uVar19;
            }
            bVar13 = mfm_track->bitfield[uVar7 - uVar8] & 1 | bVar13 * '\x02';
            uVar7 = (uVar7 - uVar8) + 2;
            uVar12 = uVar12 + 2;
          } while (uVar12 < 0xe);
          local_88.r = bVar13;
          CRC::AddByteToCrc(&local_58,bVar13);
          uVar7 = uVar11 + 0x71;
          uVar12 = 0xfffffffe;
          bVar13 = 0;
          do {
            uVar8 = mfm_track->size;
            if (uVar7 < mfm_track->size) {
              uVar8 = uVar19;
            }
            bVar13 = mfm_track->bitfield[uVar7 - uVar8] & 1 | bVar13 * '\x02';
            uVar7 = (uVar7 - uVar8) + 2;
            uVar12 = uVar12 + 2;
          } while (uVar12 < 0xe);
          local_88.n = bVar13;
          CRC::AddByteToCrc(&local_58,bVar13);
          pIVar3 = this->log_;
          if (pIVar3 != (ILog *)0x0) {
            (*(code *)**(undefined8 **)pIVar3)(pIVar3,"CHRN Found");
          }
          pIVar3 = this->log_;
          if (pIVar3 != (ILog *)0x0) {
            (**(code **)(*(long *)pIVar3 + 8))(pIVar3,local_88._8_8_ & 0xff);
          }
          pIVar3 = this->log_;
          if (pIVar3 != (ILog *)0x0) {
            (**(code **)(*(long *)pIVar3 + 8))(pIVar3,local_88.h);
          }
          pIVar3 = this->log_;
          if (pIVar3 != (ILog *)0x0) {
            (**(code **)(*(long *)pIVar3 + 8))(pIVar3,local_88.r);
          }
          pIVar3 = this->log_;
          if (pIVar3 != (ILog *)0x0) {
            (**(code **)(*(long *)pIVar3 + 8))(pIVar3,local_88.n);
          }
          uVar7 = uVar11 + 0x81;
          uVar12 = mfm_track->size;
          uVar14 = 0xfffffffe;
          uVar8 = 0;
          do {
            uVar15 = uVar12;
            if (uVar7 < uVar12) {
              uVar15 = uVar19;
            }
            uVar8 = (uint)(byte)((char)uVar8 * '\x02') | mfm_track->bitfield[uVar7 - uVar15] & 1;
            uVar7 = (uVar7 - uVar15) + 2;
            uVar14 = uVar14 + 2;
          } while (uVar14 < 0xe);
          uVar7 = uVar11 + 0x91;
          uVar15 = 0xfffffffe;
          uVar14 = 0;
          do {
            uVar16 = uVar12;
            if (uVar7 < uVar12) {
              uVar16 = uVar19;
            }
            uVar14 = (uint)(byte)((char)uVar14 * '\x02') | mfm_track->bitfield[uVar7 - uVar16] & 1;
            uVar7 = (uVar7 - uVar16) + 2;
            uVar15 = uVar15 + 2;
          } while (uVar15 < 0xe);
          uVar14 = uVar14 | uVar8 << 8;
          if ((unsigned_short)uVar14 != local_58.computed_crc_) {
            local_88._8_8_ = local_88._8_8_ | 0x200000000000;
            pIVar3 = this->log_;
            if (pIVar3 != (ILog *)0x0) {
              (*(code *)**(undefined8 **)pIVar3)(pIVar3,"HEADER CRC ERROR !");
            }
          }
          if (this->log_ != (ILog *)0x0) {
            (**(code **)(*(long *)this->log_ + 0x20))();
          }
          uVar11 = uVar11 + 0xa0;
          if (uVar11 < mfm_track->size - 0x38) {
            bVar20 = false;
            local_64 = uVar14;
            do {
              iVar5 = bcmp(&DAT_001a8b30,mfm_track->bitfield + uVar11,0x38);
              if (iVar5 == 0) {
                local_88.dam_offset = uVar11;
                local_88.dam_sync_offset = uVar11 - 0x50;
                CRC::Reset(&local_58);
                CRC::AddByteToCrc(&local_58,0xa1);
                CRC::AddByteToCrc(&local_58,0xa1);
                CRC::AddByteToCrc(&local_58,0xa1);
                uVar7 = uVar11 + 0x31;
                uVar12 = 0xfffffffe;
                bVar13 = 0;
                do {
                  uVar8 = mfm_track->size;
                  if (uVar7 < mfm_track->size) {
                    uVar8 = uVar19;
                  }
                  bVar13 = mfm_track->bitfield[uVar7 - uVar8] & 1 | bVar13 * '\x02';
                  uVar7 = (uVar7 - uVar8) + 2;
                  uVar12 = uVar12 + 2;
                } while (uVar12 < 0xe);
                CRC::AddByteToCrc(&local_58,bVar13);
                if (bVar13 == 0xf8) {
                  local_88._8_8_ = local_88._8_8_ | 0x40000000000000;
                }
                uVar11 = uVar11 + 0x40;
                bVar13 = local_88.n;
                if (7 < local_88.n) {
                  bVar13 = 8;
                }
                iVar5 = 0;
                do {
                  uVar7 = uVar11 + 1;
                  uVar12 = 0xfffffffe;
                  b = 0;
                  do {
                    uVar8 = mfm_track->size;
                    if (uVar7 < mfm_track->size) {
                      uVar8 = uVar19;
                    }
                    b = mfm_track->bitfield[uVar7 - uVar8] & 1 | b * '\x02';
                    uVar7 = (uVar7 - uVar8) + 2;
                    uVar12 = uVar12 + 2;
                  } while (uVar12 < 0xe);
                  CRC::AddByteToCrc(&local_58,b);
                  track_buffer = local_60;
                  uVar7 = mfm_track->size;
                  if (uVar11 + 0x10 < mfm_track->size) {
                    uVar7 = uVar19;
                  }
                  local_88.real_size = local_88.real_size + 1;
                  uVar11 = (uVar11 + 0x10) - uVar7;
                  iVar5 = iVar5 + 1;
                } while (iVar5 != 0x80 << (bVar13 & 0x1f));
                uVar7 = mfm_track->size;
                uVar12 = local_64;
                if (uVar11 < uVar7 - 0x20) {
                  uVar12 = uVar11 + 1;
                  uVar14 = 0xfffffffe;
                  uVar8 = 0;
                  do {
                    uVar15 = uVar7;
                    if (uVar12 < uVar7) {
                      uVar15 = uVar19;
                    }
                    uVar8 = (uint)(byte)((char)uVar8 * '\x02') |
                            mfm_track->bitfield[uVar12 - uVar15] & 1;
                    uVar12 = (uVar12 - uVar15) + 2;
                    uVar14 = uVar14 + 2;
                  } while (uVar14 < 0xe);
                  uVar12 = uVar11 + 0x11;
                  uVar15 = 0xfffffffe;
                  uVar14 = 0;
                  do {
                    uVar16 = uVar7;
                    if (uVar12 < uVar7) {
                      uVar16 = uVar19;
                    }
                    uVar14 = (uint)(byte)((char)uVar14 * '\x02') |
                             mfm_track->bitfield[uVar12 - uVar16] & 1;
                    uVar12 = (uVar12 - uVar16) + 2;
                    uVar15 = uVar15 + 2;
                  } while (uVar15 < 0xe);
                  uVar11 = uVar11 + 0x20;
                  uVar12 = uVar14 | uVar8 << 8;
                }
                if ((unsigned_short)uVar12 != local_58.computed_crc_) {
                  local_88._8_8_ = local_88._8_8_ | 0x20200000000000;
                  pIVar3 = this->log_;
                  if (pIVar3 != (ILog *)0x0) {
                    (*(code *)**(undefined8 **)pIVar3)(pIVar3,"DATA CRC ERROR !");
                  }
                }
                if (this->log_ != (ILog *)0x0) {
                  (**(code **)(*(long *)this->log_ + 0x20))();
                }
                __position._M_current =
                     (track_buffer->list_sector_).
                     super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_88.index_end = uVar11;
                if (__position._M_current ==
                    (track_buffer->list_sector_).
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<IDisk::Sector,std::allocator<IDisk::Sector>>::
                  _M_realloc_insert<IDisk::Sector_const&>
                            ((vector<IDisk::Sector,std::allocator<IDisk::Sector>> *)track_buffer,
                             __position,&local_88);
                }
                else {
                  (__position._M_current)->index_end = uVar11;
                  (__position._M_current)->real_size = local_88.real_size;
                  *(undefined2 *)&(__position._M_current)->field_0x12 = local_88._18_2_;
                  (__position._M_current)->dam_offset = local_88.dam_offset;
                  (__position._M_current)->dam_sync_offset = local_88.dam_sync_offset;
                  (__position._M_current)->data_crc_ok = local_88.data_crc_ok;
                  *(undefined3 *)&(__position._M_current)->field_0x1d = local_88._29_3_;
                  (__position._M_current)->idam_offset = local_88.idam_offset;
                  (__position._M_current)->idam_sync_offset = local_88.idam_sync_offset;
                  (__position._M_current)->c = local_88.c;
                  (__position._M_current)->h = local_88.h;
                  (__position._M_current)->r = local_88.r;
                  (__position._M_current)->n = local_88.n;
                  (__position._M_current)->chrn_crc_ok = local_88.chrn_crc_ok;
                  (__position._M_current)->status1 = local_88.status1;
                  (__position._M_current)->status2 = local_88.status2;
                  (__position._M_current)->field_0xf = local_88._15_1_;
                  ppaVar1 = &(track_buffer->list_sector_).
                             super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                uVar11 = local_88.dam_offset + 0x41;
                bVar20 = true;
                local_64 = uVar12;
              }
              else {
                uVar11 = uVar11 + 1;
              }
            } while ((uVar11 < mfm_track->size - 0x38) && (!bVar20));
          }
        }
        else {
          uVar11 = uVar11 + 1;
        }
        uVar7 = mfm_track->size;
      } while (uVar11 < uVar7 - 0x40);
    }
    paVar4 = (track_buffer->list_sector_).
             super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(track_buffer->list_sector_).
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar4;
    if (lVar9 == 0) {
      uVar7 = 0x100;
      uVar11 = 0;
    }
    else {
      uVar10 = (lVar9 >> 2) * -0x71c71c71c71c71c7;
      puVar17 = &paVar4->index_end;
      uVar18 = 0;
      uVar12 = 0x100;
      bVar20 = false;
      uVar11 = 0;
      uVar19 = 0;
      iVar5 = 0;
      do {
        if (uVar18 != 0) {
          iVar5 = (iVar5 - uVar19) + ((anon_struct_36_14_4aa84ee9 *)(puVar17 + -8))->idam_offset +
                  -0x18;
        }
        uVar19 = puVar17[-3];
        uVar8 = (uint)*(ushort *)(puVar17 + -4) * 0x10 + uVar19 + 0x24;
        if (((uVar8 <= uVar11) || (bVar20)) || (0xffff < *(ushort *)(puVar17 + -4) + uVar12)) {
          if (uVar18 < uVar10 - 1 && 1 < uVar10) {
            iVar6 = paVar4[(int)uVar18 + 1].idam_offset;
            uVar14 = iVar6 + 0xa0;
            if (uVar14 < uVar8) {
              *puVar17 = uVar14;
              *(unsigned_short *)(puVar17 + -4) = (unsigned_short)((iVar6 - uVar19) + 0x70 >> 4);
            }
          }
          else {
            *(unsigned_short *)(puVar17 + -4) =
                 (unsigned_short)(((uVar7 + 100) - uVar19) + paVar4->idam_offset >> 4);
          }
        }
        else {
          if (uVar7 < uVar8) {
            *(unsigned_short *)(puVar17 + -4) =
                 (unsigned_short)(paVar4->idam_offset + (uVar7 - uVar19) + 0x1c >> 4);
            bVar20 = true;
          }
          uVar11 = *puVar17;
        }
        if (uVar7 < (uint)*(ushort *)(puVar17 + -4) * 0x10 + uVar19 + 0x24) {
          bVar20 = true;
        }
        uVar12 = uVar12 + *(ushort *)(puVar17 + -4);
        uVar19 = *puVar17;
        uVar18 = uVar18 + 1;
        puVar17 = puVar17 + 9;
      } while ((uVar18 & 0xffffffff) <= uVar10 && uVar10 - (uVar18 & 0xffffffff) != 0);
      iVar6 = iVar5 + 0xf;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      local_60->gap3_size_ = (int)((ulong)(long)(iVar6 >> 4) / uVar10);
      track_buffer = local_60;
      uVar7 = uVar12 + 0x100;
      uVar11 = uVar12 + 0x100;
      if ((char)uVar12 == '\0') {
        uVar7 = uVar12;
        uVar11 = uVar12;
      }
    }
    track_buffer->full_size_ = uVar11;
  }
  CRC::~CRC(&local_58);
  return uVar7;
}

Assistant:

unsigned int IDisk::GetTrackInfo(MFMTrack* mfm_track, Track* track_buffer)
{
   unsigned int size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   if (mfm_track->size < (int)sizeof(pattern_fe))
   {
      return 0;
   }
   while (index < mfm_track->size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > SYNC_BIT_NUMBER * 2);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &mfm_track->bitfield[index], sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }

      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("CHRN Found");
         LOGB(sector.c );
         LOGB(sector.h );
         LOGB(sector.r );
         LOGB(sector.n );

         // Do we have CRC error ?
         unsigned short crc = GetNextByte(mfm_track, index);
         crc <<= 8;
         index += 16;
         crc |= GetNextByte(mfm_track, index);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < mfm_track->size - (int)sizeof(pattern_f)) && (!data_found))
         {
            if (memcmp(pattern_f, &mfm_track->bitfield[index], sizeof(pattern_f)) == 0)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2; // todo : Add verify

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByte(mfm_track, index);
               crc_local.AddByteToCrc(byte);
               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sectorsize = (0x80 << (std::min(sector.n, (unsigned char)0x8)));
               for (int data_count = 0;
                    data_count < sectorsize; data_count++)
               {
                  byte = GetNextByte(mfm_track, index);
                  crc_local.AddByteToCrc(byte);
                  index += 16;
                  if (index >= mfm_track->size)
                  {
                     index = index - mfm_track->size;
                  }

                  sector.real_size++;
               }
               if (index < mfm_track->size - 32)
               {
                  // CRC Check
                  crc = GetNextByte(mfm_track, index);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByte(mfm_track, index);
                  index += 16;
               }
               else
               {
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               index = sector.dam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   unsigned int offset_end = 0;
   unsigned int max_index = 0;
   bool whole_track_recorded = false;
   unsigned int finalsize = 256;

   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }

         // check size :
         //if ( track_buffer->listSector.size() > 1 && i < track_buffer->listSector.size()-1 )
         {
            // Interlaced sector :
            // Add full sector if :
            // - MaxIndex < endIndex (AND whole track is not recorded)
            // - totalsize + RealSize < 0x10000 (otherwise = problem with dsk header)
            if (max_index < track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16
               && !whole_track_recorded
               && (finalsize + track_buffer->list_sector_[i].real_size) < 0x10000)
            {
               if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
               {
                  // Skip to first IDAM found
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - (track_buffer->list_sector_[i
                  ].dam_offset + 0x24) + track_buffer->list_sector_[0].idam_offset + 64) / 16);
                  whole_track_recorded = true;
               }
               max_index = track_buffer->list_sector_[i].index_end;
            }
               // Otherwise :
               // Add until IDAMOffset + 160 bye ( 4 for idam, 4 for chrn, 4 for CRC)
            else
            {
               if (track_buffer->list_sector_.size() > 1 && i < track_buffer->list_sector_.size() - 1)
               {
                  if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > track_buffer->
                     list_sector_[i + 1].idam_offset + 160)
                  {
                     //track_buffer->listSector[i].RealSize -= (track_buffer->listSector[i].indexEnd - (track_buffer->listSector[i+1].IDAMOffset + 160))/16;
                     track_buffer->list_sector_[i].index_end = track_buffer->list_sector_[i + 1].idam_offset + 160;
                     track_buffer->list_sector_[i].real_size = (track_buffer->list_sector_[i].index_end - (track_buffer->list_sector_[i].
                        dam_offset + (3 * 16))) / 16;
                  }
               }
               else
               {
                  // Last track : go until begining of first sector
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - track_buffer->list_sector_[i]
                     .dam_offset + 0x24 + track_buffer->list_sector_[0].idam_offset + 64) / 16);
               }
            }
            if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
            {
               whole_track_recorded = true;
            }
         }
         finalsize += track_buffer->list_sector_[i].real_size;

         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += trackIn->Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((finalsize & 0xFFFFFF00) < finalsize)
      {
         finalsize += 0x100;
      }
      track_buffer->full_size_ = finalsize;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return finalsize;
}